

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

uchar * __thiscall
Fossilize::StateRecorder::Impl::copy<unsigned_char>
          (Impl *this,uchar *src,size_t count,ScratchAllocator *alloc)

{
  uchar *puVar1;
  
  if (count != 0) {
    puVar1 = ScratchAllocator::allocate_n<unsigned_char>(alloc,count);
    if (puVar1 != (uchar *)0x0) {
      puVar1 = (uchar *)memmove(puVar1,src,count);
      return puVar1;
    }
  }
  return (uchar *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}